

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.hpp
# Opt level: O2

Renderbuffer * __thiscall
deqp::gls::FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::Renderbuffer>
          (FboBuilder *this)

{
  Renderbuffer *pRVar1;
  Renderbuffer *local_18;
  
  pRVar1 = (Renderbuffer *)operator_new(0x20);
  (pRVar1->super_Image).internalFormat.format = 0;
  (pRVar1->super_Image).internalFormat.unsizedType = 0;
  (pRVar1->super_Image).width = 0;
  (pRVar1->super_Image).height = 0;
  (pRVar1->super_Image).super_Config._vptr_Config = (_func_int **)&PTR__Config_01e3c310;
  pRVar1->numSamples = 0;
  local_18 = pRVar1;
  std::
  _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
  ::_M_insert_unique<deqp::gls::FboUtil::config::Config*>
            ((_Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
              *)&this->m_configs,(Config **)&local_18);
  return pRVar1;
}

Assistant:

Config&						makeConfig		(void)
	{
		Config* cfg = new Config();
		m_configs.insert(cfg);
		return *cfg;
	}